

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O2

void error_handler_new(exr_const_context_t file,int code,char *msg)

{
  ostream *poVar1;
  char *fn;
  char *local_20;
  
  exr_get_file_name(file,&local_20);
  std::operator<<((ostream *)&std::cerr,"Core EXR ERROR:");
  if (file != (exr_const_context_t)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr," \'");
    poVar1 = std::operator<<(poVar1,local_20);
    std::operator<<(poVar1,"\'");
  }
  poVar1 = std::operator<<((ostream *)&std::cerr," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,code);
  poVar1 = std::operator<<(poVar1,"): ");
  poVar1 = std::operator<<(poVar1,msg);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static void
error_handler_new (exr_const_context_t file, int code, const char* msg)
{
    const char* fn;
    exr_get_file_name (file, &fn);
    std::cerr << "Core EXR ERROR:";
    if (file) std::cerr << " '" << fn << "'";
    std::cerr << " (" << code << "): " << msg << std::endl;
}